

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_suite.cpp
# Opt level: O2

void api_suite::api_expand_back_n(void)

{
  size_type local_68;
  undefined4 local_5c;
  circular_array<int,_4UL> data;
  
  data.super_circular_view<int,_4UL>.member.data = (pointer)&data;
  data.super_circular_view<int,_4UL>.member.size = 0;
  data.super_circular_view<int,_4UL>.member.next = 4;
  vista::circular_view<int,_4UL>::push_back(&data.super_circular_view<int,_4UL>,0xb);
  vista::circular_view<int,_4UL>::push_back(&data.super_circular_view<int,_4UL>,0xb);
  local_68 = data.super_circular_view<int,_4UL>.member.size;
  local_5c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x112,"void api_suite::api_expand_back_n()",&local_68,&local_5c);
  data.super_circular_view<int,_4UL>.member.next =
       (ulong)((uint)data.super_circular_view<int,_4UL>.member.next & 3) ^ 6;
  local_68 = data.super_circular_view<int,_4UL>.member.size + 2;
  if (data.super_circular_view<int,_4UL>.member.size - 3 < 2) {
    local_68 = 4;
  }
  local_5c = 4;
  data.super_circular_view<int,_4UL>.member.size = local_68;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x114,"void api_suite::api_expand_back_n()",&local_68,&local_5c);
  return;
}

Assistant:

void api_expand_back_n()
{
    circular_array<int, 4> data;
    data.push_back(11);
    data.push_back(11);
    BOOST_TEST_EQ(data.size(), 2);
    data.expand_back(2);
    BOOST_TEST_EQ(data.size(), 4);
}